

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void xmlHashScanFull3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,
                     xmlHashScannerFull scan,void *data)

{
  xmlHashEntry *pxVar1;
  xmlChar *s2;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  xmlHashEntry *pxVar7;
  void *pvVar8;
  xmlHashEntry *pxVar9;
  
  if ((hash != (xmlHashTablePtr)0x0) &&
     (uVar5 = (ulong)hash->size, scan != (xmlHashScannerFull)0x0 && uVar5 != 0)) {
    pxVar1 = hash->table;
    pxVar7 = pxVar1 + uVar5;
    pxVar9 = pxVar1;
    while (pxVar9->hashValue != 0) {
      pxVar9 = pxVar9 + 1;
      if (pxVar7 <= pxVar9) {
        pxVar9 = pxVar1;
      }
    }
    for (uVar6 = 0; uVar6 < (uint)uVar5; uVar6 = uVar6 + 1) {
      if ((pxVar9->hashValue != 0) && (pvVar8 = pxVar9->payload, pvVar8 != (void *)0x0)) {
        while (((key == (xmlChar *)0x0 ||
                (iVar4 = strcmp((char *)key,(char *)pxVar9->key), iVar4 == 0)) &&
               (((key2 == (xmlChar *)0x0 || (iVar4 = xmlFastStrEqual(key2,pxVar9->key2), iVar4 != 0)
                 ) && ((s2 = pxVar9->key3, key3 == (xmlChar *)0x0 ||
                       (iVar4 = xmlFastStrEqual(key3,s2), iVar4 != 0))))))) {
          pxVar2 = pxVar9->key;
          pxVar3 = pxVar9->key2;
          (*scan)(pvVar8,data,pxVar2,pxVar3,s2);
          if (((pxVar9->hashValue == 0) || (pvVar8 = pxVar9->payload, pvVar8 == (void *)0x0)) ||
             ((pxVar9->key == pxVar2 && ((pxVar9->key2 == pxVar3 && (pxVar9->key3 == s2)))))) break;
        }
      }
      pxVar9 = pxVar9 + 1;
      if (pxVar7 <= pxVar9) {
        pxVar9 = hash->table;
      }
      uVar5 = (ulong)hash->size;
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                if (((key != NULL) && (strcmp((const char *) key,
                                              (const char *) entry->key) != 0)) ||
                    ((key2 != NULL) && (!xmlFastStrEqual(key2, entry->key2))) ||
                    ((key3 != NULL) && (!xmlFastStrEqual(key3, entry->key3))))
                    break;
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}